

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O3

int4 __thiscall ActionDefaultParams::apply(ActionDefaultParams *this,Funcdata *data)

{
  FuncCallSpecs *this_00;
  Datatype *vt;
  EVP_PKEY_CTX *in_RDX;
  EVP_PKEY_CTX *extraout_RDX;
  uint uVar1;
  ulong uVar2;
  ProtoModel *m;
  
  m = data->glb->evalfp_called;
  if (m == (ProtoModel *)0x0) {
    m = data->glb->defaultfp;
  }
  uVar1 = (uint)((ulong)((long)(data->qlst).
                               super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(data->qlst).
                              super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      this_00 = (data->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar2];
      if ((this_00->super_FuncProto).model == (ProtoModel *)0x0) {
        if (this_00->fd == (Funcdata *)0x0) {
          vt = &TypeFactory::getTypeVoid(data->glb->types)->super_Datatype;
          FuncProto::setInternal(&this_00->super_FuncProto,m,vt);
        }
        else {
          FuncProto::copy(&this_00->super_FuncProto,(EVP_PKEY_CTX *)&this_00->fd->funcp,in_RDX);
          if ((((this_00->super_FuncProto).flags & 4) == 0) &&
             ((this_00->super_FuncProto).model != m)) {
            FuncProto::setModel(&this_00->super_FuncProto,m);
          }
        }
      }
      FuncCallSpecs::insertPcode(this_00,data);
      Funcdata::updateOpFromSpec(data,this_00);
      uVar2 = uVar2 + 1;
      in_RDX = extraout_RDX;
    } while ((uVar1 & 0x7fffffff) != uVar2);
  }
  return 0;
}

Assistant:

int4 ActionDefaultParams::apply(Funcdata &data)

{
  int4 i,size;
  FuncCallSpecs *fc;
  ProtoModel *evalfp = data.getArch()->evalfp_called; // Special model used when evaluating called funcs
  if (evalfp == (ProtoModel *)0) // If no special evaluation
    evalfp = data.getArch()->defaultfp;	// Use the default model

  size = data.numCalls();
  for(i=0;i<size;++i) {
    fc = data.getCallSpecs(i);
    if (!fc->hasModel()) {
      Funcdata *otherfunc = fc->getFuncdata();
      
      if (otherfunc != (Funcdata *)0) {
	fc->copy(otherfunc->getFuncProto());
	if ((!fc->isModelLocked())&&(!fc->hasMatchingModel(evalfp)))
	  fc->setModel(evalfp);
      }
      else
	fc->setInternal(evalfp,data.getArch()->types->getTypeVoid());
    }
    fc->insertPcode(data);	// Insert any necessary pcode
    data.updateOpFromSpec(fc);
  }
  return 0;			// Indicate success
}